

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmDec.c
# Opt level: O1

void Abc_NtkAreaOpt2(Sfm_Dec_t *p)

{
  byte *pbVar1;
  int iVar2;
  uint uVar3;
  long *plVar4;
  undefined8 uVar5;
  void *pvVar6;
  uint *__ptr;
  void *pvVar7;
  Vec_Ptr_t *pVVar8;
  Abc_Obj_t *pAVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  uint uVar14;
  uint uVar15;
  Abc_Obj_t *pAVar16;
  
  pVVar8 = p->pNtk->vObjs;
  iVar2 = pVVar8->nSize;
  __ptr = (uint *)malloc(0x10);
  __ptr[0] = 1000;
  __ptr[1] = 0;
  pvVar7 = malloc(8000);
  *(void **)(__ptr + 2) = pvVar7;
  if (0 < (long)iVar2) {
    lVar13 = 0;
    do {
      pvVar7 = pVVar8->pArray[lVar13];
      if ((pvVar7 != (void *)0x0) && ((*(byte *)((long)pvVar7 + 0x14) & 0x20) != 0)) {
        __assert_fail("pObj->fMarkB == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmDec.c"
                      ,0x799,"void Abc_NtkAreaOpt2(Sfm_Dec_t *)");
      }
      lVar13 = lVar13 + 1;
    } while (iVar2 != lVar13);
  }
  pVVar8 = p->pNtk->vCos;
  if (0 < pVVar8->nSize) {
    lVar13 = 0;
    do {
      plVar4 = (long *)pVVar8->pArray[lVar13];
      lVar12 = *(long *)(*(long *)(*(long *)(*plVar4 + 0x20) + 8) + (long)*(int *)plVar4[4] * 8);
      uVar14 = *(uint *)(lVar12 + 0x14);
      if ((uVar14 & 0x2f) == 7) {
        *(uint *)(lVar12 + 0x14) = uVar14 | 0x20;
        uVar5 = *(undefined8 *)
                 (*(long *)(*(long *)(*plVar4 + 0x20) + 8) + (long)*(int *)plVar4[4] * 8);
        uVar14 = __ptr[1];
        uVar3 = *__ptr;
        if (uVar14 == uVar3) {
          if ((int)uVar3 < 0x10) {
            if (*(void **)(__ptr + 2) == (void *)0x0) {
              pvVar7 = malloc(0x80);
            }
            else {
              pvVar7 = realloc(*(void **)(__ptr + 2),0x80);
            }
            uVar15 = 0x10;
          }
          else {
            uVar15 = uVar3 * 2;
            if ((int)uVar15 <= (int)uVar3) goto LAB_00524556;
            if (*(void **)(__ptr + 2) == (void *)0x0) {
              pvVar7 = malloc((ulong)uVar3 << 4);
            }
            else {
              pvVar7 = realloc(*(void **)(__ptr + 2),(ulong)uVar3 << 4);
            }
          }
          *(void **)(__ptr + 2) = pvVar7;
          *__ptr = uVar15;
        }
LAB_00524556:
        __ptr[1] = uVar14 + 1;
        *(undefined8 *)(*(long *)(__ptr + 2) + (long)(int)uVar14 * 8) = uVar5;
      }
      lVar13 = lVar13 + 1;
      pVVar8 = p->pNtk->vCos;
    } while (lVar13 < pVVar8->nSize);
  }
  uVar14 = __ptr[1];
  if (0 < (int)uVar14) {
    pvVar7 = *(void **)(__ptr + 2);
    lVar13 = 0;
    do {
      pAVar16 = *(Abc_Obj_t **)((long)pvVar7 + lVar13 * 8);
      if ((pAVar16->field_0x14 & 0xf) != 0) {
        pAVar9 = Abc_NtkAreaOptOne(p,pAVar16->Id);
        if (pAVar9 == (Abc_Obj_t *)0x0) {
LAB_0052463d:
          uVar3 = (pAVar16->vFanins).nSize;
          uVar11 = (ulong)uVar3;
          if (0 < (int)uVar3) {
            lVar12 = 0;
            do {
              if (0 < (int)uVar11) {
                pvVar6 = pAVar16->pNtk->vObjs->pArray[(pAVar16->vFanins).pArray[lVar12]];
                if ((*(uint *)((long)pvVar6 + 0x14) & 0x2f) == 7) {
                  *(uint *)((long)pvVar6 + 0x14) = *(uint *)((long)pvVar6 + 0x14) | 0x20;
                  uVar3 = *__ptr;
                  if (uVar14 == uVar3) {
                    if ((int)uVar3 < 0x10) {
                      if (pvVar7 == (void *)0x0) {
                        pvVar7 = malloc(0x80);
                      }
                      else {
                        pvVar7 = realloc(pvVar7,0x80);
                      }
                      uVar15 = 0x10;
                    }
                    else {
                      uVar15 = uVar3 * 2;
                      if ((int)uVar15 <= (int)uVar3) goto LAB_005246e8;
                      if (pvVar7 == (void *)0x0) {
                        pvVar7 = malloc((ulong)uVar3 << 4);
                      }
                      else {
                        pvVar7 = realloc(pvVar7,(ulong)uVar3 << 4);
                      }
                    }
                    *__ptr = uVar15;
                  }
LAB_005246e8:
                  lVar10 = (long)(int)uVar14;
                  uVar14 = uVar14 + 1;
                  *(void **)((long)pvVar7 + lVar10 * 8) = pvVar6;
                }
              }
              lVar12 = lVar12 + 1;
              uVar11 = (ulong)(pAVar16->vFanins).nSize;
            } while (lVar12 < (long)uVar11);
          }
        }
        else {
          uVar3 = *(uint *)&pAVar9->field_0x14;
          if ((((uVar3 & 0xf) == 7) && ((uVar3 & 0x20) == 0)) && ((pAVar9->vFanins).nSize != 0)) {
            pAVar16 = pAVar9;
            if (iVar2 <= pAVar9->Id) goto LAB_0052463d;
            *(uint *)&pAVar9->field_0x14 = uVar3 | 0x20;
            uVar3 = *__ptr;
            if (uVar14 == uVar3) {
              if ((int)uVar3 < 0x10) {
                if (pvVar7 == (void *)0x0) {
                  pvVar7 = malloc(0x80);
                }
                else {
                  pvVar7 = realloc(pvVar7,0x80);
                }
                uVar15 = 0x10;
              }
              else {
                uVar15 = uVar3 * 2;
                if ((int)uVar15 <= (int)uVar3) goto LAB_0052475a;
                if (pvVar7 == (void *)0x0) {
                  pvVar7 = malloc((ulong)uVar3 << 4);
                }
                else {
                  pvVar7 = realloc(pvVar7,(ulong)uVar3 << 4);
                }
              }
              *__ptr = uVar15;
            }
LAB_0052475a:
            lVar12 = (long)(int)uVar14;
            uVar14 = uVar14 + 1;
            *(Abc_Obj_t **)((long)pvVar7 + lVar12 * 8) = pAVar9;
          }
        }
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 < (int)uVar14);
    *(void **)(__ptr + 2) = pvVar7;
  }
  __ptr[1] = uVar14;
  pVVar8 = p->pNtk->vObjs;
  if (0 < pVVar8->nSize) {
    lVar13 = 0;
    do {
      if (pVVar8->pArray[lVar13] != (void *)0x0) {
        pbVar1 = (byte *)((long)pVVar8->pArray[lVar13] + 0x14);
        *pbVar1 = *pbVar1 & 0xdf;
      }
      lVar13 = lVar13 + 1;
      pVVar8 = p->pNtk->vObjs;
    } while (lVar13 < pVVar8->nSize);
  }
  if (*(void **)(__ptr + 2) != (void *)0x0) {
    free(*(void **)(__ptr + 2));
    __ptr[2] = 0;
    __ptr[3] = 0;
  }
  free(__ptr);
  return;
}

Assistant:

void Abc_NtkAreaOpt2( Sfm_Dec_t * p )
{
    Abc_Obj_t * pObj, * pObjNew, * pFanin; 
    int i, k, nStop = Abc_NtkObjNumMax(p->pNtk);
    Vec_Ptr_t * vFront = Vec_PtrAlloc( 1000 );
    Abc_NtkForEachObj( p->pNtk, pObj, i )
        assert( pObj->fMarkB == 0 );
    // start the queue of nodes to be tried
    Abc_NtkForEachCo( p->pNtk, pObj, i )
        if ( Abc_ObjIsNode(Abc_ObjFanin0(pObj)) && !Abc_ObjFanin0(pObj)->fMarkB )
        {
            Abc_ObjFanin0(pObj)->fMarkB = 1;
            Vec_PtrPush( vFront, Abc_ObjFanin0(pObj) );
        }
    // process nodes in this order
    Vec_PtrForEachEntry( Abc_Obj_t *, vFront, pObj, i )
    {
        if ( Abc_ObjIsNone(pObj) )
            continue;
        pObjNew = Abc_NtkAreaOptOne( p, Abc_ObjId(pObj) );
        if ( pObjNew != NULL )
        {
            if ( !Abc_ObjIsNode(pObjNew) || Abc_ObjFaninNum(pObjNew) == 0 || pObjNew->fMarkB )
                continue;
            if ( (int)Abc_ObjId(pObjNew) < nStop )
            {
                pObjNew->fMarkB = 1;
                Vec_PtrPush( vFront, pObjNew );
                continue;
            }
        }
        else
            pObjNew = pObj;
        Abc_ObjForEachFanin( pObjNew, pFanin, k )
            if ( Abc_ObjIsNode(pFanin) && Abc_ObjFaninNum(pObjNew) > 0 && !pFanin->fMarkB )
            {
                pFanin->fMarkB = 1;
                Vec_PtrPush( vFront, pFanin );
            }
    }
    Abc_NtkForEachObj( p->pNtk, pObj, i )
        pObj->fMarkB = 0;
    Vec_PtrFree( vFront );
}